

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

void __thiscall gl4cts::TextureViewTestGetTexParameter::deinit(TextureViewTestGetTexParameter *this)

{
  pointer p_Var1;
  GLuint *pGVar2;
  int iVar3;
  undefined4 extraout_var;
  GLuint *pGVar5;
  long lVar4;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  p_Var1 = (this->m_test_runs).
           super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (p_Var1 != (this->m_test_runs).
                super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pGVar2 = &p_Var1->texture_view_object_created_from_view_to_id;
    do {
      pGVar5 = pGVar2;
      if (pGVar5[-2] != 0) {
        (**(code **)(lVar4 + 0x480))(1,pGVar5 + -2);
        pGVar5[-2] = 0;
      }
      if (pGVar5[-1] != 0) {
        (**(code **)(lVar4 + 0x480))(1,pGVar5 + -1);
        pGVar5[-1] = 0;
      }
      if (*pGVar5 != 0) {
        (**(code **)(lVar4 + 0x480))(1,pGVar5);
        *pGVar5 = 0;
      }
      pGVar2 = pGVar5 + 10;
    } while ((pointer)(pGVar5 + 3) !=
             (this->m_test_runs).
             super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    p_Var1 = (this->m_test_runs).
             super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pointer)(pGVar5 + 3) != p_Var1) {
      (this->m_test_runs).
      super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
      ._M_impl.super__Vector_impl_data._M_finish = p_Var1;
    }
  }
  return;
}

Assistant:

void TextureViewTestGetTexParameter::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Deinitialize all test runs */
	for (_test_runs_iterator it = m_test_runs.begin(); it != m_test_runs.end(); ++it)
	{
		_test_run& test_run = *it;

		if (test_run.parent_texture_object_id != 0)
		{
			gl.deleteTextures(1, &test_run.parent_texture_object_id);

			test_run.parent_texture_object_id = 0;
		}

		if (test_run.texture_view_object_created_from_immutable_to_id != 0)
		{
			gl.deleteTextures(1, &test_run.texture_view_object_created_from_immutable_to_id);

			test_run.texture_view_object_created_from_immutable_to_id = 0;
		}

		if (test_run.texture_view_object_created_from_view_to_id != 0)
		{
			gl.deleteTextures(1, &test_run.texture_view_object_created_from_view_to_id);

			test_run.texture_view_object_created_from_view_to_id = 0;
		}
	}
	m_test_runs.clear();
}